

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef lj_opt_cse(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  IRRef2 IVar3;
  uint uVar4;
  IRIns *pIVar5;
  IRIns *ir;
  uint local_30;
  IRRef ref_1;
  IRRef lim;
  IRRef ref;
  IROp op;
  IRRef2 op12;
  jit_State *J_local;
  IRRef ref_2;
  
  IVar3 = (uint)(J->fold).ins.field_0.op1 + (uint)(J->fold).ins.field_0.op2 * 0x10000;
  uVar4 = (uint)(J->fold).ins.field_1.o;
  if ((J->flags & 0x20000) != 0) {
    uVar1 = J->chain[uVar4];
    local_30 = (uint)(J->fold).ins.field_0.op1;
    if (local_30 < (J->fold).ins.field_0.op2) {
      local_30 = (uint)(J->fold).ins.field_0.op2;
    }
    while (ref_1 = (IRRef)uVar1, local_30 < ref_1) {
      if ((J->cur).ir[ref_1].field_1.op12 == IVar3) {
        return ref_1 + (uint)*(byte *)((long)(J->cur).ir + (ulong)ref_1 * 8 + 4) * 0x1000000;
      }
      uVar1 = *(ushort *)((long)(J->cur).ir + (ulong)ref_1 * 8 + 6);
    }
  }
  uVar2 = (J->cur).nins;
  if (J->irtoplim <= uVar2) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar2 + 1;
  pIVar5 = (J->cur).ir + uVar2;
  (pIVar5->field_0).prev = J->chain[uVar4];
  (pIVar5->field_1).op12 = IVar3;
  J->chain[uVar4] = (IRRef1)uVar2;
  (pIVar5->field_1).o = (J->fold).ins.field_1.o;
  (J->guardemit).irt = (J->guardemit).irt | (J->fold).ins.field_1.t.irt;
  (pIVar5->field_1).t.irt = (J->fold).ins.field_1.t.irt;
  return uVar2 + (uint)(pIVar5->field_1).t.irt * 0x1000000;
}

Assistant:

TRef LJ_FASTCALL lj_opt_cse(jit_State *J)
{
  /* Avoid narrow to wide store-to-load forwarding stall */
  IRRef2 op12 = (IRRef2)fins->op1 + ((IRRef2)fins->op2 << 16);
  IROp op = fins->o;
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    /* Limited search for same operands in per-opcode chain. */
    IRRef ref = J->chain[op];
    IRRef lim = fins->op1;
    if (fins->op2 > lim) lim = fins->op2;  /* Relies on lit < REF_BIAS. */
    while (ref > lim) {
      if (IR(ref)->op12 == op12)
	return TREF(ref, irt_t(IR(ref)->t));  /* Common subexpression found. */
      ref = IR(ref)->prev;
    }
  }
  /* Otherwise emit IR (inlined for speed). */
  {
    IRRef ref = lj_ir_nextins(J);
    IRIns *ir = IR(ref);
    ir->prev = J->chain[op];
    ir->op12 = op12;
    J->chain[op] = (IRRef1)ref;
    ir->o = fins->o;
    J->guardemit.irt |= fins->t.irt;
    return TREF(ref, irt_t((ir->t = fins->t)));
  }
}